

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O1

void pfx_table_free(pfx_table *pfx_table)

{
  pthread_rwlock_t *__rwlock;
  long lVar1;
  trie_node *root;
  uint *puVar2;
  undefined8 uVar3;
  pfx_record pVar4;
  trie_node *ptr;
  long lVar5;
  ulong uVar6;
  int iVar7;
  long in_FS_OFFSET;
  bool bVar8;
  pfx_record record;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined6 uStack_46;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __rwlock = &pfx_table->lock;
  iVar7 = 0;
  do {
    root = (&pfx_table->ipv4)[iVar7 != 0];
    if (root != (trie_node *)0x0) {
      pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
      do {
        puVar2 = (uint *)root->data;
        if (*puVar2 != 0) {
          lVar5 = 0;
          uVar6 = 0;
          do {
            uVar3 = *(undefined8 *)((long)&(root->prefix).u + 4);
            uStack_5c = (undefined4)*(undefined8 *)&root->prefix;
            uStack_58 = (undefined4)((ulong)*(undefined8 *)&root->prefix >> 0x20);
            uStack_54 = (undefined4)uVar3;
            uStack_50 = (undefined4)((ulong)uVar3 >> 0x20);
            if (pfx_table->update_fp != (pfx_update_fp)0x0) {
              pVar4.prefix.ver = uStack_5c;
              pVar4.asn = *(undefined4 *)(*(long *)(puVar2 + 2) + lVar5);
              pVar4.prefix.u.addr6.addr[1] = uStack_54;
              pVar4.prefix.u.addr6.addr[0] = uStack_58;
              pVar4.prefix.u.addr6.addr[3] = (root->prefix).u.addr6.addr[3];
              pVar4.prefix.u.addr6.addr[2] = uStack_50;
              pVar4.max_len = *(undefined1 *)(*(long *)(puVar2 + 2) + 4 + lVar5);
              pVar4.min_len = root->len;
              pVar4._26_6_ = uStack_46;
              pVar4.socket = *(rtr_socket **)(*(long *)(puVar2 + 2) + 8 + lVar5);
              (*pfx_table->update_fp)(pfx_table,pVar4,false);
            }
            uVar6 = uVar6 + 1;
            lVar5 = lVar5 + 0x10;
          } while (uVar6 < *puVar2);
        }
        ptr = trie_remove(root,&root->prefix,root->len,0);
        if (ptr == (trie_node *)0x0) {
          __assert_fail("rm_node",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie-pfx.c"
                        ,99,"void pfx_table_free(struct pfx_table *)");
        }
        lrtr_free(*(void **)((long)ptr->data + 8));
        lrtr_free(ptr->data);
        lrtr_free(ptr);
      } while (ptr != root);
      (&pfx_table->ipv4)[iVar7 != 0] = (trie_node *)0x0;
      pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    }
    bVar8 = iVar7 != 0;
    iVar7 = iVar7 + 1;
    if (bVar8) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        pthread_rwlock_destroy((pthread_rwlock_t *)__rwlock);
        return;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

RTRLIB_EXPORT void pfx_table_free(struct pfx_table *pfx_table)
{
	for (int i = 0; i < 2; i++) {
		struct trie_node *root = (i == 0 ? pfx_table->ipv4 : pfx_table->ipv6);

		if (root) {
			struct trie_node *rm_node;

			pthread_rwlock_wrlock(&(pfx_table->lock));
			do {
				struct node_data *data = (struct node_data *)(root->data);

				for (unsigned int j = 0; j < data->len; j++) {
					struct pfx_record record = {data->ary[j].asn, (root->prefix), root->len,
								    data->ary[j].max_len, data->ary[j].socket};
					pfx_table_notify_clients(pfx_table, &record, false);
				}
				rm_node = (trie_remove(root, &(root->prefix), root->len, 0));
				assert(rm_node);
				lrtr_free(((struct node_data *)rm_node->data)->ary);
				lrtr_free(rm_node->data);
				lrtr_free(rm_node);
			} while (rm_node != root);
			if (i == 0)
				pfx_table->ipv4 = NULL;
			else
				pfx_table->ipv6 = NULL;

			pthread_rwlock_unlock(&(pfx_table->lock));
		}
	}
	pthread_rwlock_destroy(&(pfx_table->lock));
}